

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

void cf_he_adjust_pollset(Curl_cfilter *cf,Curl_easy *data,easy_pollset *ps)

{
  void *pvVar1;
  long lVar2;
  Curl_cfilter *cf_00;
  curl_trc_feat *pcVar3;
  long lVar4;
  
  if ((cf->field_0x24 & 1) == 0) {
    pvVar1 = cf->ctx;
    lVar4 = 0;
    do {
      lVar2 = *(long *)((long)pvVar1 + lVar4 * 8 + 0x20);
      if ((lVar2 != 0) && (cf_00 = *(Curl_cfilter **)(lVar2 + 0x28), cf_00 != (Curl_cfilter *)0x0))
      {
        Curl_conn_cf_adjust_pollset(cf_00,data,ps);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 == 1);
    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
      pcVar3 = (data->state).feat;
      if (pcVar3 == (curl_trc_feat *)0x0) {
        if (cf == (Curl_cfilter *)0x0) {
          return;
        }
      }
      else {
        if (cf == (Curl_cfilter *)0x0) {
          return;
        }
        if (pcVar3->log_level < 1) {
          return;
        }
      }
      if (0 < cf->cft->log_level) {
        Curl_trc_cf_infof(data,cf,"adjust_pollset -> %d socks",(ulong)ps->num);
        return;
      }
    }
  }
  return;
}

Assistant:

static void cf_he_adjust_pollset(struct Curl_cfilter *cf,
                                  struct Curl_easy *data,
                                  struct easy_pollset *ps)
{
  struct cf_he_ctx *ctx = cf->ctx;
  size_t i;

  if(!cf->connected) {
    for(i = 0; i < ARRAYSIZE(ctx->baller); i++) {
      struct eyeballer *baller = ctx->baller[i];
      if(!baller || !baller->cf)
        continue;
      Curl_conn_cf_adjust_pollset(baller->cf, data, ps);
    }
    CURL_TRC_CF(data, cf, "adjust_pollset -> %d socks", ps->num);
  }
}